

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

void __thiscall Js::AsmJSByteCodeGenerator::LoadAllConstants(AsmJSByteCodeGenerator *this)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  FunctionBody *this_00;
  Type *pTVar4;
  TypedRegisterAllocator *this_01;
  undefined4 *puVar5;
  AsmJsSIMDValue zeroValue;
  byte *byteTable;
  uint32 srcByteOffset;
  Types type;
  int i;
  TypedConstSourcesInfo constSourcesInfo;
  byte *tableEnd;
  Type *table;
  FunctionBody *funcBody;
  AsmJSByteCodeGenerator *this_local;
  
  this_00 = AsmJsFunc::GetFuncBody(this->mFunction);
  FunctionBody::CreateConstantTable(this_00);
  pTVar4 = FunctionBody::GetConstTable(this_00);
  RVar3 = FunctionBody::GetConstantCount(this_00);
  constSourcesInfo._16_8_ = pTVar4 + RVar3;
  this_01 = AsmJsFunc::GetTypedRegisterAllocator(this->mFunction);
  WAsmJs::TypedRegisterAllocator::GetConstSourceInfos((TypedConstSourcesInfo *)&type,this_01);
  srcByteOffset = 0;
  do {
    if (4 < (int)srcByteOffset) {
      return;
    }
    zeroValue.field_0.i64[1] = (long)&pTVar4->ptr + (ulong)(&type)[(int)srcByteOffset];
    if ((&type)[(int)srcByteOffset] != ~INT32) {
      switch(srcByteOffset) {
      case 0:
        zeroValue.field_0.f64[1] =
             (Type)SetConstsToTable<int>(this,(byte *)zeroValue.field_0.f64[1],0);
        break;
      case 1:
        SetConstsToTable<long>(this,(byte *)zeroValue.field_0.f64[1],0);
        break;
      case 2:
        zeroValue.field_0.f64[1] =
             (Type)SetConstsToTable<float>(this,(byte *)zeroValue.field_0.f64[1],0.0);
        break;
      case 3:
        zeroValue.field_0.f64[1] =
             (Type)SetConstsToTable<double>(this,(byte *)zeroValue.field_0.f64[1],0.0);
        break;
      case 4:
        zeroValue.field_0.f64[1] =
             (Type)SetConstsToTable<_SIMDValue>
                             (this,(byte *)zeroValue.field_0.f64[1],(_SIMDValue)ZEXT816(0));
        break;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0xa2,"(false)","false");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if ((ulong)constSourcesInfo._16_8_ < (ulong)zeroValue.field_0.f64[1]) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0xa7,"((0))","UNREACHED");
        if (bVar2) {
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
          Throw::FatalInternalError(-0x7fffbffb);
        }
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    srcByteOffset = srcByteOffset + 1;
  } while( true );
}

Assistant:

void AsmJSByteCodeGenerator::LoadAllConstants()
    {
        FunctionBody *funcBody = mFunction->GetFuncBody();
        funcBody->CreateConstantTable();
        auto table = funcBody->GetConstTable();
        byte* tableEnd = (byte*)(table + funcBody->GetConstantCount());

        WAsmJs::TypedConstSourcesInfo constSourcesInfo = mFunction->GetTypedRegisterAllocator().GetConstSourceInfos();
        for (int i = 0; i < WAsmJs::LIMIT; ++i)
        {
            WAsmJs::Types type = (WAsmJs::Types)i;
            uint32 srcByteOffset = constSourcesInfo.srcByteOffsets[i];
            byte* byteTable = ((byte*)table) + srcByteOffset;
            if (srcByteOffset != Js::Constants::InvalidOffset)
            {
                switch (type)
                {
                case WAsmJs::INT32: byteTable = SetConstsToTable<int>(byteTable, 0); break;
                case WAsmJs::FLOAT32: byteTable = SetConstsToTable<float>(byteTable, 0); break;
                case WAsmJs::FLOAT64: byteTable = SetConstsToTable<double>(byteTable, 0); break;
#if TARGET_64
                case WAsmJs::INT64: SetConstsToTable<int64>(byteTable, 0); break;
#endif
                case WAsmJs::SIMD:
                {
                    AsmJsSIMDValue zeroValue;
                    zeroValue.f64[0] = 0; zeroValue.f64[1] = 0;
                    byteTable = SetConstsToTable<AsmJsSIMDValue>(byteTable, zeroValue);
                    break;
                }
                default:
                    Assert(false);
                    break;
                }
                if (byteTable > tableEnd)
                {
                    Assert(UNREACHED);
                    Js::Throw::FatalInternalError();
                }
            }
        }
    }